

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O1

void __thiscall Saturation::SaturationAlgorithm::doUnprocessedLoop(SaturationAlgorithm *this)

{
  UnprocessedClauseContainer *this_00;
  PassiveClauseContainer *pPVar1;
  bool bVar2;
  Clause *cl;
  
  do {
    while( true ) {
      newClausesToUnprocessed(this);
      this_00 = this->_unprocessed;
      if ((this_00->_data)._front == (this_00->_data)._back) break;
      cl = UnprocessedClauseContainer::pop(this_00);
      (*(this->super_MainLoop)._vptr_MainLoop[0xe])(this,cl);
      bVar2 = forwardSimplify(this,cl);
      if (bVar2) {
        (*(this->super_MainLoop)._vptr_MainLoop[0xb])(this);
        Kernel::Clause::setStore(cl,PASSIVE);
        *(int *)(DAT_00b7e1c0 + 0x1d8) = *(int *)(DAT_00b7e1c0 + 0x1d8) + 1;
        pPVar1 = (this->_passive)._M_t.
                 super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                 .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl;
        (**(code **)(*(long *)&(pPVar1->super_RandomAccessClauseContainer).super_ClauseContainer +
                    0x10))(pPVar1,cl);
      }
      else {
        Kernel::Clause::setStore(cl,NONE);
      }
    }
    onAllProcessed(this);
  } while (((this->_unprocessed->_data)._front != (this->_unprocessed->_data)._back) ||
          ((this->_newClauses)._s._cursor != (this->_newClauses)._s._stack));
  return;
}

Assistant:

void SaturationAlgorithm::doUnprocessedLoop()
{
  do {
    newClausesToUnprocessed();

    while (!_unprocessed->isEmpty()) {
      Clause* c = _unprocessed->pop();
      poppedFromUnprocessed(c); // tells LRS's it might make sense to update limits

      ASS(!isRefutation(c));

      if (forwardSimplify(c)) {
        onClauseRetained(c);
        addToPassive(c);
        ASS_EQ(c->store(), Clause::PASSIVE);
      }
      else {
        ASS_EQ(c->store(), Clause::UNPROCESSED);
        c->setStore(Clause::NONE);
      }

      newClausesToUnprocessed();
    }

    ASS(clausesFlushed());
    onAllProcessed(); // in particular, Splitter has now recomputed model which may have triggered deletions and additions
  } while (!clausesFlushed());
}